

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O1

void display_player(wchar_t mode)

{
  ushort uVar1;
  wchar_t wVar2;
  ui_entry *puVar3;
  cached_object_data *cache;
  char_sheet_config *pcVar4;
  byte bVar5;
  _Bool _Var6;
  wchar_t wVar7;
  wchar_t c;
  wchar_t wVar8;
  panel *p;
  wchar_t *pwVar9;
  wchar_t *pwVar10;
  void *pvVar11;
  cached_object_data **ppcVar12;
  object *poVar13;
  long lVar14;
  wchar_t a;
  ulong uVar15;
  wchar_t *pwVar16;
  cached_object_data **cache_00;
  wchar_t *pwVar17;
  wchar_t slot;
  long lVar18;
  bool bVar19;
  cached_player_data *pcache;
  cached_player_data *local_80;
  long local_78;
  ui_entry_details local_6c;
  cached_object_data **local_48;
  void *local_40;
  wchar_t *local_38;
  
  if ((cached_config == (char_sheet_config *)0x0) ||
     (cached_config->res_cols != cached_config->res_nlabel + (uint)(player->body).count + L'\x01'))
  {
    configure_char_sheet();
  }
  clear_from(L'\0');
  if ((Term == angband_term[0]) || (player->upkeep->playing == true)) {
    display_player_stat_info();
    if (mode == L'\0') {
      display_player_xtra_info();
      return;
    }
    p = get_panel_topleft();
    display_panel(p,true,&panels[0].bounds);
    panel_free(p);
    pcVar4 = cached_config;
    pwVar9 = (wchar_t *)mem_alloc((ulong)(player->body).count * 4 + 4);
    pwVar10 = (wchar_t *)mem_alloc((ulong)(player->body).count * 4 + 4);
    pvVar11 = mem_alloc((ulong)(player->body).count << 3);
    ppcVar12 = (cached_object_data **)mem_zalloc((ulong)(player->body).count << 3);
    local_80 = (cached_player_data *)0x0;
    if ((player->body).count != 0) {
      uVar15 = 0;
      do {
        poVar13 = slot_object(player,(wchar_t)uVar15);
        *(object **)((long)pvVar11 + uVar15 * 8) = poVar13;
        uVar15 = uVar15 + 1;
      } while (uVar15 < (player->body).count);
    }
    c_put_str('\x01',"abcdefgimnop@",L'\x01',L'\x1a');
    local_6c.label_position.x = (uint)(player->body).count + L'\x1f';
    local_6c.value_position.x = L'\x1a';
    local_6c.position_step = (loc)loc(1,0);
    local_6c.combined_position = (loc)loc(0,0);
    local_6c.vertical_label = false;
    local_6c.alternate_color_first = false;
    local_6c.known_rune = true;
    local_6c.show_combined = false;
    if (L'\0' < pcVar4->n_stat_mod_entries) {
      lVar18 = 0;
      do {
        puVar3 = pcVar4->stat_mod_entries[lVar18];
        uVar1 = (player->body).count;
        if (uVar1 != 0) {
          uVar15 = 0;
          pwVar16 = pwVar9;
          cache_00 = ppcVar12;
          pwVar17 = pwVar10;
          local_78 = lVar18;
          do {
            compute_ui_entry_values_for_object
                      (puVar3,*(object **)((long)pvVar11 + uVar15 * 8),player,cache_00,pwVar16,
                       pwVar17);
            uVar15 = uVar15 + 1;
            uVar1 = (player->body).count;
            pwVar17 = pwVar17 + 1;
            pwVar16 = pwVar16 + 1;
            cache_00 = cache_00 + 1;
            lVar18 = local_78;
          } while (uVar15 < uVar1);
        }
        compute_ui_entry_values_for_player(puVar3,player,&local_80,pwVar9 + uVar1,pwVar10 + uVar1);
        pwVar9[(player->body).count] = L'\0';
        local_6c.label_position.y = (int)lVar18 + L'\x02';
        local_6c.value_position.y = local_6c.label_position.y;
        wVar7 = get_ui_entry_renderer_index(puVar3);
        ui_entry_renderer_apply
                  (wVar7,(wchar_t *)0x0,L'\0',pwVar9,pwVar10,(uint)(player->body).count + L'\x01',
                   &local_6c);
        lVar18 = lVar18 + 1;
      } while (lVar18 < pcVar4->n_stat_mod_entries);
    }
    if (local_80 != (cached_player_data *)0x0) {
      release_cached_player_data(local_80);
    }
    if ((player->body).count != 0) {
      uVar15 = 0;
      do {
        if (ppcVar12[uVar15] != (cached_object_data *)0x0) {
          release_cached_object_data(ppcVar12[uVar15]);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < (player->body).count);
    }
    mem_free(ppcVar12);
    mem_free(pvVar11);
    mem_free(pwVar10);
    mem_free(pwVar9);
    lVar18 = 0;
    do {
      pcVar4 = cached_config;
      local_38 = (wchar_t *)mem_alloc((ulong)(player->body).count * 4 + 4);
      pwVar9 = (wchar_t *)mem_alloc((ulong)(player->body).count * 4 + 4);
      pvVar11 = mem_alloc((ulong)(player->body).count << 3);
      local_48 = (cached_object_data **)mem_zalloc((ulong)(player->body).count << 3);
      local_80 = (cached_player_data *)0x0;
      wVar7 = pcVar4->res_regions[lVar18].col;
      wVar8 = pcVar4->res_regions[lVar18].row;
      local_40 = pvVar11;
      if ((player->body).count == 0) {
        bVar19 = true;
      }
      else {
        uVar15 = 0;
        do {
          poVar13 = slot_object(player,(wchar_t)uVar15);
          *(object **)((long)pvVar11 + uVar15 * 8) = poVar13;
          uVar15 = uVar15 + 1;
          uVar1 = (player->body).count;
        } while (uVar15 < uVar1);
        bVar19 = uVar1 == 0;
      }
      if (!bVar19) {
        wVar2 = pcVar4->res_nlabel;
        slot = L'\0';
        do {
          poVar13 = slot_object(player,slot);
          c = L' ';
          a = L'\x01';
          if (((poVar13 != (object *)0x0) && (tile_width == '\x01')) && (tile_height == '\x01')) {
            bVar5 = object_attr(poVar13);
            c = object_char(poVar13);
            a = (wchar_t)bVar5;
          }
          Term_putch(wVar2 + wVar7 + slot,wVar8,a,c);
          slot = slot + L'\x01';
        } while ((uint)slot < (uint)(player->body).count);
      }
      Term_putstr(wVar7,wVar8 + L'\x01',pcVar4->res_cols,L'\x01',"      abcdefgimnop@");
      local_6c.value_position.x = wVar7 + pcVar4->res_nlabel;
      local_6c.label_position.x = wVar7;
      local_6c.position_step = (loc)loc(1,0);
      local_6c.combined_position = (loc)loc(0,0);
      local_6c._32_4_ = ((uint)local_6c._32_4_ >> 0x10 & 0xff) << 0x10;
      pwVar10 = local_38;
      if (L'\0' < pcVar4->n_resist_by_region[lVar18]) {
        wVar8 = wVar8 + L'\x02';
        lVar14 = 0;
        pwVar16 = local_38;
        do {
          pvVar11 = local_40;
          local_78 = lVar14 * 0x20;
          puVar3 = pcVar4->resists_by_region[lVar18][lVar14].entry;
          if ((player->body).count == 0) {
            uVar1 = 0;
            pwVar10 = pwVar16;
          }
          else {
            uVar15 = 0;
            ppcVar12 = local_48;
            pwVar17 = pwVar9;
            do {
              compute_ui_entry_values_for_object
                        (puVar3,*(object **)((long)pvVar11 + uVar15 * 8),player,ppcVar12,pwVar16,
                         pwVar17);
              uVar15 = uVar15 + 1;
              uVar1 = (player->body).count;
              pwVar17 = pwVar17 + 1;
              pwVar16 = pwVar16 + 1;
              ppcVar12 = ppcVar12 + 1;
              pwVar10 = local_38;
            } while (uVar15 < uVar1);
          }
          compute_ui_entry_values_for_player(puVar3,player,&local_80,pwVar10 + uVar1,pwVar9 + uVar1)
          ;
          local_6c.label_position.y = wVar8;
          local_6c.value_position.y = wVar8;
          _Var6 = is_ui_entry_for_known_rune(puVar3,player);
          local_6c.known_rune = _Var6;
          wVar7 = get_ui_entry_renderer_index(puVar3);
          ui_entry_renderer_apply
                    (wVar7,(wchar_t *)((long)pcVar4->resists_by_region[lVar18]->label + local_78),
                     pcVar4->res_nlabel,pwVar10,pwVar9,(uint)(player->body).count + L'\x01',
                     &local_6c);
          lVar14 = lVar14 + 1;
          wVar8 = wVar8 + L'\x01';
          pwVar16 = pwVar10;
        } while (lVar14 < pcVar4->n_resist_by_region[lVar18]);
      }
      if (local_80 != (cached_player_data *)0x0) {
        release_cached_player_data(local_80);
      }
      ppcVar12 = local_48;
      if ((player->body).count != 0) {
        uVar15 = 0;
        do {
          cache = ppcVar12[uVar15];
          if (cache != (cached_object_data *)0x0) {
            release_cached_object_data(cache);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < (player->body).count);
      }
      mem_free(ppcVar12);
      mem_free(local_40);
      mem_free(pwVar9);
      mem_free(pwVar10);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 4);
  }
  return;
}

Assistant:

void display_player(int mode)
{
	if (!have_valid_char_sheet_config()) {
		configure_char_sheet();
	}

	/* Erase screen */
	clear_from(0);

	/* When not playing, do not display in subwindows */
	if (Term != angband_term[0] && !player->upkeep->playing) return;

	/* Stat info */
	display_player_stat_info();

	if (mode) {
		struct panel *p = panels[0].panel();
		display_panel(p, panels[0].align_left, &panels[0].bounds);
		panel_free(p);

		/* Stat/Sustain flags */
		display_player_sust_info(cached_config);

		/* Other flags */
		display_player_flag_info();
	} else {
		/* Extra info */
		display_player_xtra_info();
	}
}